

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O2

void amrex::WriteSingleLevelPlotfile
               (string *plotfilename,MultiFab *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Geometry *geom,Real time,int level_step,string *versionName,
               string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  int level_step_local;
  Real local_98;
  Vector<int,_std::allocator<int>_> level_steps;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> ref_ratio;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> geomarr;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> mfarr;
  
  level_step_local = level_step;
  local_98 = time;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)mf;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            (&mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>,
             1,(value_type *)&geomarr,(allocator_type *)&level_steps);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            (&geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,1,geom,
             (allocator_type *)&level_steps);
  std::vector<int,_std::allocator<int>_>::vector
            (&level_steps.super_vector<int,_std::allocator<int>_>,1,&level_step_local,
             (allocator_type *)&ref_ratio);
  ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WriteMultiLevelPlotfile
            (plotfilename,1,&mfarr,varnames,&geomarr,local_98,&level_steps,&ref_ratio,versionName,
             levelPrefix,mfPrefix,extra_dirs);
  std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
            ((_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&ref_ratio);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&level_steps);
  std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base
            ((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&geomarr);
  std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
  ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                &mfarr);
  return;
}

Assistant:

void
WriteSingleLevelPlotfile (const std::string& plotfilename,
                          const MultiFab& mf, const Vector<std::string>& varnames,
                          const Geometry& geom, Real time, int level_step,
                          const std::string &versionName,
                          const std::string &levelPrefix,
                          const std::string &mfPrefix,
                          const Vector<std::string>& extra_dirs)
{
    Vector<const MultiFab*> mfarr(1,&mf);
    Vector<Geometry> geomarr(1,geom);
    Vector<int> level_steps(1,level_step);
    Vector<IntVect> ref_ratio;

    WriteMultiLevelPlotfile(plotfilename, 1, mfarr, varnames, geomarr, time,
                            level_steps, ref_ratio, versionName, levelPrefix, mfPrefix, extra_dirs);
}